

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O0

int ARKStepComputeState(void *arkode_mem,N_Vector zcor,N_Vector z)

{
  realtype in_RDX;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  int retval;
  N_Vector in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 local_4;
  
  local_4 = arkStep_AccessStepMem
                      ((void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                       in_stack_ffffffffffffffd0,(ARKodeMem *)in_stack_ffffffffffffffc8,
                       (ARKodeARKStepMem *)0xe8ce4c);
  if (local_4 == 0) {
    N_VLinearSum(in_RDX,(N_Vector)(ulong)in_stack_ffffffffffffffd8,
                 (realtype)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(N_Vector)0xe8ce83);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ARKStepComputeState(void *arkode_mem, N_Vector zcor, N_Vector z)
{
  int retval;
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "ARKStepComputeState",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  N_VLinearSum(ONE, step_mem->zpred, ONE, zcor, z);

  return(ARK_SUCCESS);
}